

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::GetDatePartFunction<duckdb::DatePart::DayOfWeekOperator>(void)

{
  ScalarFunctionSet *in_RDI;
  code *local_48 [2];
  code *local_38;
  code *local_30;
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::DayOfWeekOperator>;
  local_10 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  local_48[1] = (code *)0x0;
  local_48[0] = DatePart::
                UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::DayOfWeekOperator>;
  local_30 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_38 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
            (in_RDI,(duckdb *)local_28,(scalar_function_t *)local_48,
             (scalar_function_t *)&stack0xffffffffffffff98,
             (scalar_function_t *)DatePart::DayOfWeekOperator::PropagateStatistics<duckdb::date_t>,
             DatePart::DayOfWeekOperator::PropagateStatistics<duckdb::timestamp_t>,
             ScalarFunction::
             UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::DayOfWeekOperator>);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff98);
  ::std::_Function_base::~_Function_base((_Function_base *)local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)local_28);
  return in_RDI;
}

Assistant:

static ScalarFunctionSet GetDatePartFunction() {
	return GetGenericDatePartFunction(
	    DatePart::UnaryFunction<date_t, int64_t, OP>, DatePart::UnaryFunction<timestamp_t, int64_t, OP>,
	    ScalarFunction::UnaryFunction<interval_t, int64_t, OP>, OP::template PropagateStatistics<date_t>,
	    OP::template PropagateStatistics<timestamp_t>);
}